

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_start_seqimap(Parser *this)

{
  pfn_error p_Var1;
  Tree *this_00;
  code *pcVar2;
  char *pcVar3;
  Location LVar4;
  NodeType_e NVar5;
  bool bVar6;
  State *pSVar7;
  size_t sVar8;
  NodeData *pNVar9;
  char *__filename;
  NodeScalar *pNVar10;
  csubstr cVar11;
  char *pcStack_78;
  size_t local_70;
  char msg [35];
  
  pSVar7 = this->m_state;
  if ((~pSVar7->flags & 0x18U) != 0) {
    builtin_strncpy(msg,"check failed: (has_all(RSEQ|FLOW))",0x23);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar11.len;
    pcStack_78 = cVar11.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x78cc) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x78cc) << 0x40,8);
    LVar4.name.str = pcStack_78;
    LVar4.name.len = local_70;
    (*p_Var1)(msg,0x23,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar7 = this->m_state;
  }
  bVar6 = Tree::has_children(this->m_tree,pSVar7->node_id);
  if (bVar6) {
    this_00 = this->m_tree;
    sVar8 = Tree::last_child(this_00,this->m_state->node_id);
    pNVar9 = Tree::_p(this_00,sVar8);
    if (((pNVar9->m_type).type & VAL) != NOTYPE) {
      __filename = (char *)Tree::last_child(this->m_tree,this->m_state->node_id);
      pNVar9 = Tree::_p(this->m_tree,(size_t)__filename);
      NVar5 = (pNVar9->m_type).type;
      pNVar10 = Tree::valsc(this->m_tree,(size_t)__filename);
      msg._0_8_ = (pNVar10->tag).str;
      msg._8_8_ = (pNVar10->tag).len;
      cVar11 = pNVar10->scalar;
      pcVar3 = (pNVar10->anchor).str;
      sVar8 = (pNVar10->anchor).len;
      Tree::remove(this->m_tree,__filename);
      _push_level(this,false);
      _start_map(this,true);
      _store_scalar(this,cVar11,(uint)((~(int)NVar5 & 0x1001U) == 0));
      (this->m_key_anchor).str = pcVar3;
      (this->m_key_anchor).len = sVar8;
      (this->m_key_tag).str = (char *)msg._0_8_;
      (this->m_key_tag).len = msg._8_8_;
      goto LAB_001c9a8b;
    }
  }
  _push_level(this,false);
  _start_map(this,true);
  _store_scalar_null(this,(this->m_state->line_contents).rem.str);
LAB_001c9a8b:
  this->m_state->flags = this->m_state->flags | 0x2010;
  return;
}

Assistant:

void Parser::_start_seqimap()
{
    _c4dbgpf("start_seqimap at node={}. has_children={}", m_state->node_id, m_tree->has_children(m_state->node_id));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ|FLOW));
    // create a map, and turn the last scalar of this sequence
    // into the key of the map's first child. This scalar was
    // understood to be a value in the sequence, but it is
    // actually a key of a map, implicitly opened here.
    // Eg [val, key: val]
    //
    // Yep, YAML is crazy.
    if(m_tree->has_children(m_state->node_id) && m_tree->has_val(m_tree->last_child(m_state->node_id)))
    {
        size_t prev = m_tree->last_child(m_state->node_id);
        NodeType ty = m_tree->_p(prev)->m_type; // don't use type() because it masks out the quotes
        NodeScalar tmp = m_tree->valsc(prev);
        _c4dbgpf("has children and last child={} has val. saving the scalars, val='{}' quoted={}", prev, tmp.scalar, ty.is_val_quoted());
        m_tree->remove(prev);
        _push_level();
        _start_map();
        _store_scalar(tmp.scalar, ty.is_val_quoted());
        m_key_anchor = tmp.anchor;
        m_key_tag = tmp.tag;
    }
    else
    {
        _c4dbgpf("node {} has no children yet, using empty key", m_state->node_id);
        _push_level();
        _start_map();
        _store_scalar_null(m_state->line_contents.rem.str);
    }
    add_flags(RSEQIMAP|FLOW);
}